

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O1

void __thiscall GroupInfo::~GroupInfo(GroupInfo *this)

{
  if (this->name != (char *)0x0) {
    operator_delete__(this->name);
  }
  if (this->description != (char *)0x0) {
    operator_delete__(this->description);
    return;
  }
  return;
}

Assistant:

~GroupInfo() {
		if (name)
			delete[] name;
		if (description)
			delete[] description;
	}